

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

void Internal_ValidateBrepComponentBackPtr
               (ON__UINT_PTR text_log_ptr_plus,wchar_t *corruption_descirption,bool *bCorrupt,
               ON_Brep *this_brep,ON_Brep **brep_back_ptr,int idx,int *component_back_idx)

{
  if (*brep_back_ptr != this_brep) {
    if (((text_log_ptr_plus & 1) == 0) && (*bCorrupt == false)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep.cpp"
                 ,0x1156,"","ON_Brep has corrupt indices that will cause crashes.");
    }
    *bCorrupt = true;
    if ((ON_TextLog *)(text_log_ptr_plus & 0xfffffffffffffffc) != (ON_TextLog *)0x0) {
      ON_TextLog::Print((ON_TextLog *)(text_log_ptr_plus & 0xfffffffffffffffc),
                        corruption_descirption);
    }
    if ((text_log_ptr_plus & 2) != 0) {
      *brep_back_ptr = this_brep;
    }
  }
  if (*component_back_idx != idx) {
    if (((text_log_ptr_plus & 1) == 0) && (*bCorrupt == false)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep.cpp"
                 ,0x1167,"","ON_Brep has corrupt indices that will cause crashes.");
    }
    *bCorrupt = true;
    if ((ON_TextLog *)(text_log_ptr_plus & 0xfffffffffffffffc) != (ON_TextLog *)0x0) {
      ON_TextLog::Print((ON_TextLog *)(text_log_ptr_plus & 0xfffffffffffffffc),
                        corruption_descirption);
    }
    if ((text_log_ptr_plus & 2) != 0) {
      *component_back_idx = idx;
    }
  }
  return;
}

Assistant:

static void Internal_ValidateBrepComponentBackPtr(
  ON__UINT_PTR text_log_ptr_plus,
  const wchar_t* corruption_descirption,
  bool& bCorrupt,
  const ON_Brep* this_brep,
  ON_Brep*const* brep_back_ptr,
  const int idx,
  const int& component_back_idx
)
{
  if (this_brep != *brep_back_ptr)
  {
    const bool bSilentError = (0 != (text_log_ptr_plus & 1));
    const bool bRepair = (0 != (text_log_ptr_plus & 2));
    ON_TextLog* text_log = (ON_TextLog*)(text_log_ptr_plus & (~((ON__UINT_PTR)3)) );

    if (false == bCorrupt && false == bSilentError)
    {
      ON_ERROR("ON_Brep has corrupt indices that will cause crashes.");
    }
    bCorrupt = true;
    if (nullptr != text_log)
      text_log->Print(corruption_descirption);
    if (bRepair)
      *const_cast<ON_Brep**>(brep_back_ptr) = const_cast<ON_Brep*>(this_brep);
  }

  if (idx != component_back_idx)
  {
    const bool bSilentError = (0 != (text_log_ptr_plus & 1));
    const bool bRepair = (0 != (text_log_ptr_plus & 2));
    ON_TextLog* text_log = (ON_TextLog*)(text_log_ptr_plus & (~((ON__UINT_PTR)3)));

    if (false == bCorrupt && false == bSilentError)
    {
      ON_ERROR("ON_Brep has corrupt indices that will cause crashes.");
    }
    bCorrupt = true;
    if (nullptr != text_log)
      text_log->Print(corruption_descirption);
    if (bRepair)
      const_cast<int&>(component_back_idx) = idx;
  }
}